

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkproxy.cpp
# Opt level: O1

void __thiscall QGlobalNetworkProxy::~QGlobalNetworkProxy(QGlobalNetworkProxy *this)

{
  QNetworkProxy *this_00;
  
  this_00 = this->applicationLevelProxy;
  if (this_00 != (QNetworkProxy *)0x0) {
    QNetworkProxy::~QNetworkProxy(this_00);
    operator_delete(this_00,8);
  }
  if (this->applicationLevelProxyFactory != (QNetworkProxyFactory *)0x0) {
    (*this->applicationLevelProxyFactory->_vptr_QNetworkProxyFactory[1])();
  }
  if (this->socks5SocketEngineHandler != (QSocks5SocketEngineHandler *)0x0) {
    (*(this->socks5SocketEngineHandler->super_QSocketEngineHandler)._vptr_QSocketEngineHandler[1])()
    ;
  }
  if (this->httpSocketEngineHandler != (QHttpSocketEngineHandler *)0x0) {
    (*(this->httpSocketEngineHandler->super_QSocketEngineHandler)._vptr_QSocketEngineHandler[1])();
  }
  QRecursiveMutex::~QRecursiveMutex(&this->mutex);
  return;
}

Assistant:

~QGlobalNetworkProxy()
    {
        delete applicationLevelProxy;
        delete applicationLevelProxyFactory;
#if QT_CONFIG(socks5)
        delete socks5SocketEngineHandler;
#endif
#if QT_CONFIG(http)
        delete httpSocketEngineHandler;
#endif
    }